

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O0

vec4F basisu::compute_ssim(imagef *a,imagef *b)

{
  vec<4U,_float> *in_RSI;
  undefined8 extraout_XMM0_Qa;
  vec4F vVar2;
  float C2;
  float C1;
  imagef t3;
  imagef t2;
  imagef t1;
  imagef smap;
  imagef s12;
  imagef s2_sq;
  imagef s1_sq;
  imagef mu1_mu2;
  imagef mu2_sq;
  imagef mu1_sq;
  imagef mu2;
  imagef mu1;
  imagef b_sq;
  imagef a_sq;
  imagef axb;
  float in_stack_fffffffffffffc1c;
  vec<4U,_float> *in_stack_fffffffffffffc20;
  imagef *in_stack_fffffffffffffc58;
  imagef *in_stack_fffffffffffffc70;
  vec4F *in_stack_fffffffffffffc78;
  imagef *in_stack_fffffffffffffc80;
  imagef *in_stack_fffffffffffffc88;
  imagef *in_stack_fffffffffffffc90;
  imagef *in_stack_fffffffffffffc98;
  imagef *in_stack_fffffffffffffca0;
  imagef *in_stack_fffffffffffffca8;
  imagef *in_stack_fffffffffffffcb0;
  vec4F *in_stack_fffffffffffffcb8;
  imagef *in_stack_fffffffffffffcc0;
  vec4F *in_stack_fffffffffffffcc8;
  imagef *in_stack_fffffffffffffcd0;
  uint32_t in_stack_fffffffffffffd54;
  uint32_t in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  float in_stack_fffffffffffffd60;
  uint32_t in_stack_fffffffffffffd64;
  imagef *in_stack_fffffffffffffd68;
  imagef *in_stack_fffffffffffffd70;
  undefined8 uVar1;
  
  imagef::imagef((imagef *)0x528889);
  imagef::imagef((imagef *)0x528896);
  imagef::imagef((imagef *)0x5288a5);
  imagef::imagef((imagef *)0x5288b4);
  imagef::imagef((imagef *)0x5288c3);
  imagef::imagef((imagef *)0x5288d2);
  imagef::imagef((imagef *)0x5288e1);
  imagef::imagef((imagef *)0x5288f0);
  imagef::imagef((imagef *)0x5288ff);
  imagef::imagef((imagef *)0x52890e);
  imagef::imagef((imagef *)0x52891d);
  imagef::imagef((imagef *)0x52892c);
  imagef::imagef((imagef *)0x52893b);
  imagef::imagef((imagef *)0x52894a);
  imagef::imagef((imagef *)0x528959);
  vec<4U,_float>::vec(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
  pow_image(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(vec4F *)in_stack_fffffffffffffca0);
  vec<4U,_float>::vec(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
  pow_image(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(vec4F *)in_stack_fffffffffffffca0);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  mul_image(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
            in_stack_fffffffffffffc78);
  gaussian_filter(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                  in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd5f,
                  in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
  gaussian_filter(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                  in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd5f,
                  in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  pow_image(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(vec4F *)in_stack_fffffffffffffca0);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  pow_image(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,(vec4F *)in_stack_fffffffffffffca0);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  mul_image(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
            in_stack_fffffffffffffc78);
  gaussian_filter(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                  in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd5f,
                  in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  add_weighted_image(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8,(vec4F *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8);
  gaussian_filter(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                  in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd5f,
                  in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  add_weighted_image(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8,(vec4F *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8);
  gaussian_filter(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                  in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd5f,
                  in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  add_weighted_image(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     in_stack_fffffffffffffcb8,(vec4F *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  scale_image(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(vec4F *)in_stack_fffffffffffffc90
              ,(vec4F *)in_stack_fffffffffffffc88);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  adds_image(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  scale_image(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(vec4F *)in_stack_fffffffffffffc90
              ,(vec4F *)in_stack_fffffffffffffc88);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  adds_image(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  mul_image(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
            in_stack_fffffffffffffc78);
  add_image(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  adds_image(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  add_image(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  adds_image(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  mul_image(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
            in_stack_fffffffffffffc78);
  vec<4U,_float>::vec(in_RSI,in_stack_fffffffffffffc1c);
  div_image(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
            in_stack_fffffffffffffc78);
  vVar2 = avg_image(in_stack_fffffffffffffc58);
  uVar1 = vVar2.m_v._8_8_;
  imagef::~imagef((imagef *)0x528f88);
  imagef::~imagef((imagef *)0x528f95);
  imagef::~imagef((imagef *)0x528fa2);
  imagef::~imagef((imagef *)0x528faf);
  imagef::~imagef((imagef *)0x528fbc);
  imagef::~imagef((imagef *)0x528fc9);
  imagef::~imagef((imagef *)0x528fd6);
  imagef::~imagef((imagef *)0x528fe3);
  imagef::~imagef((imagef *)0x528ff0);
  imagef::~imagef((imagef *)0x528ffd);
  imagef::~imagef((imagef *)0x52900a);
  imagef::~imagef((imagef *)0x529017);
  imagef::~imagef((imagef *)0x529024);
  imagef::~imagef((imagef *)0x529031);
  imagef::~imagef((imagef *)0x52903e);
  vVar2.m_v[2] = (float)(int)uVar1;
  vVar2.m_v[3] = (float)(int)((ulong)uVar1 >> 0x20);
  vVar2.m_v[0] = (float)(int)extraout_XMM0_Qa;
  vVar2.m_v[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (vec4F)vVar2.m_v;
}

Assistant:

vec4F compute_ssim(const imagef &a, const imagef &b)
	{
		imagef axb, a_sq, b_sq, mu1, mu2, mu1_sq, mu2_sq, mu1_mu2, s1_sq, s2_sq, s12, smap, t1, t2, t3;

		const float C1 = 6.50250f, C2 = 58.52250f;
				
		pow_image(a, a_sq, vec4F(2));
		pow_image(b, b_sq, vec4F(2));
		mul_image(a, b, axb, vec4F(1.0f));

		gaussian_filter(mu1, a, 11, 1.5f * 1.5f);
		gaussian_filter(mu2, b, 11, 1.5f * 1.5f);

		pow_image(mu1, mu1_sq, vec4F(2));
		pow_image(mu2, mu2_sq, vec4F(2));
		mul_image(mu1, mu2, mu1_mu2, vec4F(1.0f));

		gaussian_filter(s1_sq, a_sq, 11, 1.5f * 1.5f);
		add_weighted_image(s1_sq, vec4F(1), mu1_sq, vec4F(-1), vec4F(0), s1_sq);

		gaussian_filter(s2_sq, b_sq, 11, 1.5f * 1.5f);
		add_weighted_image(s2_sq, vec4F(1), mu2_sq, vec4F(-1), vec4F(0), s2_sq);

		gaussian_filter(s12, axb, 11, 1.5f * 1.5f);
		add_weighted_image(s12, vec4F(1), mu1_mu2, vec4F(-1), vec4F(0), s12);

		scale_image(mu1_mu2, t1, vec4F(2), vec4F(0));
		adds_image(t1, vec4F(C1), t1);

		scale_image(s12, t2, vec4F(2), vec4F(0));
		adds_image(t2, vec4F(C2), t2);

		mul_image(t1, t2, t3, vec4F(1));

		add_image(mu1_sq, mu2_sq, t1);
		adds_image(t1, vec4F(C1), t1);

		add_image(s1_sq, s2_sq, t2);
		adds_image(t2, vec4F(C2), t2);

		mul_image(t1, t2, t1, vec4F(1));

		div_image(t3, t1, smap, vec4F(1));

		return avg_image(smap);
	}